

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Error cff_charset_compute_cids(CFF_Charset charset,FT_UInt num_glyphs,FT_Memory memory)

{
  uint in_EAX;
  FT_UShort *pFVar1;
  uint uVar2;
  FT_Error FVar3;
  ulong uVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uStack_28;
  FT_Error error;
  
  uStack_28 = (ulong)in_EAX;
  FVar3 = 0;
  if (charset->max_cid == 0) {
    uVar5 = 0;
    for (uVar4 = 0; num_glyphs != uVar4; uVar4 = uVar4 + 1) {
      uVar6 = charset->sids[uVar4];
      if (charset->sids[uVar4] <= uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
    }
    pFVar1 = (FT_UShort *)ft_mem_realloc(memory,2,0,(ulong)uVar5 + 1,(void *)0x0,&error);
    charset->cids = pFVar1;
    FVar3 = error;
    if (error == 0) {
      for (uVar2 = num_glyphs - 1; uVar2 < num_glyphs; uVar2 = uVar2 - 1) {
        pFVar1[charset->sids[uVar2]] = (FT_UShort)uVar2;
      }
      charset->max_cid = (uint)uVar5;
      charset->num_glyphs = num_glyphs;
      FVar3 = 0;
    }
  }
  return FVar3;
}

Assistant:

static FT_Error
  cff_charset_compute_cids( CFF_Charset  charset,
                            FT_UInt      num_glyphs,
                            FT_Memory    memory )
  {
    FT_Error   error   = FT_Err_Ok;
    FT_UInt    i;
    FT_UShort  max_cid = 0;


    if ( charset->max_cid > 0 )
      goto Exit;

    for ( i = 0; i < num_glyphs; i++ )
    {
      if ( charset->sids[i] > max_cid )
        max_cid = charset->sids[i];
    }

    if ( FT_NEW_ARRAY( charset->cids, (FT_ULong)max_cid + 1 ) )
      goto Exit;

    /* When multiple GIDs map to the same CID, we choose the lowest */
    /* GID.  This is not described in any spec, but it matches the  */
    /* behaviour of recent Acroread versions.  The loop stops when  */
    /* the unsigned index wraps around after reaching zero.         */
    for ( i = num_glyphs - 1; i < num_glyphs; i-- )
      charset->cids[charset->sids[i]] = (FT_UShort)i;

    charset->max_cid    = max_cid;
    charset->num_glyphs = num_glyphs;

  Exit:
    return error;
  }